

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FatBackup.cpp
# Opt level: O0

void __thiscall FatBackup::backup(FatBackup *this,string *backupFile,int fat)

{
  int iVar1;
  char *__filename;
  FILE *__stream;
  ostream *poVar2;
  undefined8 uVar3;
  int local_5cc;
  int local_5c8;
  int toRead;
  int i;
  ostringstream local_5b8 [8];
  ostringstream oss;
  FILE *backup;
  int offset;
  int n;
  int size;
  char buffer [1024];
  int fat_local;
  string *backupFile_local;
  FatBackup *this_local;
  
  offset = (int)((this->super_FatModule).system)->fatSize;
  backup._4_4_ = 0;
  __filename = (char *)std::__cxx11::string::c_str();
  __stream = fopen(__filename,"w+");
  if (fat == 0) {
    offset = offset << 1;
  }
  if (fat == 2) {
    backup._4_4_ = (int)((this->super_FatModule).system)->fatSize;
  }
  if (__stream == (FILE *)0x0) {
    std::__cxx11::ostringstream::ostringstream(local_5b8);
    poVar2 = std::operator<<((ostream *)local_5b8,"Unable to open file ");
    poVar2 = std::operator<<(poVar2,(string *)backupFile);
    std::operator<<(poVar2," for writing");
    uVar3 = __cxa_allocate_exception(0x20);
    std::__cxx11::ostringstream::str();
    __cxa_throw(uVar3,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
  }
  for (local_5c8 = 0; local_5c8 < offset; local_5c8 = iVar1 + local_5c8) {
    local_5cc = 0x400;
    if (offset - local_5c8 < 0x400) {
      local_5cc = offset - local_5c8;
    }
    iVar1 = FatSystem::readData((this->super_FatModule).system,
                                ((this->super_FatModule).system)->fatStart + (long)local_5c8 +
                                (long)backup._4_4_,(char *)&n,local_5cc);
    if (0 < iVar1) {
      fwrite(&n,(long)iVar1,1,__stream);
    }
  }
  fclose(__stream);
  poVar2 = std::operator<<((ostream *)&std::cout,"Successfully wrote ");
  poVar2 = std::operator<<(poVar2,(string *)backupFile);
  poVar2 = std::operator<<(poVar2," (");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,offset);
  poVar2 = std::operator<<(poVar2,")");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void FatBackup::backup(string backupFile, int fat)
{
    char buffer[CHUNKS_SIZES];
    int size = system.fatSize;
    int n = 0;
    int offset = 0;
    FILE *backup = fopen(backupFile.c_str(), "w+");

    if (fat == 0) {
        size *= 2;
    } 
    if (fat == 2) {
        offset = system.fatSize;
    }

    if (backup == NULL) {
        ostringstream oss;
        oss << "Unable to open file " << backupFile << " for writing";
        throw oss.str();
    }

    for (int i=0; i<size; i+=n) {
        int toRead = CHUNKS_SIZES;
        if (size-i < toRead) {
            toRead = size-i;
        }
        n = system.readData(system.fatStart+i+offset, buffer, toRead);
        if (n > 0) {
            fwrite(buffer, n, 1, backup);
        }
    }

    fclose(backup);
    cout << "Successfully wrote " << backupFile << " (" << size << ")" << endl;
}